

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::binary_op_min<float>>(Mat *a,float b,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  long in_RDI;
  float fVar5;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  binary_op_min<float> op;
  float *x;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  Mat *in_stack_ffffffffffffff88;
  int local_30;
  
  iVar1 = *(int *)(in_RDI + 0x2c);
  iVar2 = *(int *)(in_RDI + 0x30);
  iVar3 = *(int *)(in_RDI + 0x34);
  for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
    Mat::channel(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    pfVar4 = Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff88);
    Mat::~Mat((Mat *)0x19fe68);
    x = pfVar4;
    for (in_stack_ffffffffffffff84 = 0; in_stack_ffffffffffffff84 < iVar1 * iVar2;
        in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
      fVar5 = binary_op_min<float>::operator()
                        ((binary_op_min<float> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),x,
                         (float *)0x19fea3);
      pfVar4[in_stack_ffffffffffffff84] = fVar5;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = a.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = op(ptr[i], b);
        }
    }

    return 0;
}